

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::tryGetEntry(Impl *this,StringPtr name)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong in_RCX;
  ulong uVar5;
  Clock *pCVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar8 = name.content.ptr + 0x18;
  pcVar7 = pcVar8;
  for (pcVar4 = *(char **)(name.content.ptr + 0x20); pcVar4 != (char *)0x0;
      pcVar4 = *(char **)(pcVar4 + (ulong)bVar2 * 8 + 0x10)) {
    uVar1 = *(ulong *)(pcVar4 + 0x28);
    uVar5 = uVar1;
    if (uVar1 >= in_RCX) {
      uVar5 = in_RCX;
    }
    iVar3 = memcmp(*(void **)(pcVar4 + 0x20),(void *)name.content.size_,uVar5);
    bVar2 = iVar3 < 0;
    if (iVar3 == 0) {
      bVar2 = uVar1 < in_RCX;
    }
    if (bVar2 == false) {
      pcVar7 = pcVar4;
    }
  }
  pcVar4 = pcVar8;
  if (pcVar7 != pcVar8) {
    uVar1 = *(ulong *)(pcVar7 + 0x28);
    uVar5 = uVar1;
    if (in_RCX < uVar1) {
      uVar5 = in_RCX;
    }
    iVar3 = memcmp((void *)name.content.size_,*(void **)(pcVar7 + 0x20),uVar5);
    bVar2 = iVar3 < 0;
    if (iVar3 == 0) {
      bVar2 = in_RCX < uVar1;
    }
    pcVar4 = pcVar7;
    if (bVar2) {
      pcVar4 = pcVar8;
    }
  }
  pCVar6 = (Clock *)0x0;
  if (pcVar4 != pcVar8) {
    pCVar6 = (Clock *)(pcVar4 + 0x30);
  }
  this->clock = pCVar6;
  return (Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this;
}

Assistant:

kj::Maybe<const EntryImpl&> tryGetEntry(kj::StringPtr name) const {
      auto iter = entries.find(name);
      if (iter == entries.end()) {
        return kj::none;
      } else {
        return iter->second;
      }
    }